

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

int __thiscall
semver::detail::prerelease_comparator::compare_identifier
          (prerelease_comparator *this,prerelease_identifier *lhs,prerelease_identifier *rhs)

{
  string_view sVar1;
  string_view sVar2;
  prerelease_identifier *rhs_local;
  prerelease_identifier *lhs_local;
  prerelease_comparator *this_local;
  
  if ((lhs->type == numeric) && (rhs->type == numeric)) {
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&lhs->identifier);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&rhs->identifier);
    this_local._4_4_ = compare_numerically(sVar2,sVar1);
  }
  else if ((lhs->type == alphanumeric) && (rhs->type == alphanumeric)) {
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&lhs->identifier);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&rhs->identifier);
    this_local._4_4_ = compare(sVar2,sVar1);
  }
  else {
    this_local._4_4_ = -1;
    if (lhs->type == alphanumeric) {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR int compare_identifier(const prerelease_identifier& lhs, const prerelease_identifier& rhs) const noexcept {
    if (lhs.type == prerelease_identifier_type::numeric && rhs.type == prerelease_identifier_type::numeric) {
      return compare_numerically(lhs.identifier, rhs.identifier);
    } else if (lhs.type == prerelease_identifier_type::alphanumeric && rhs.type == prerelease_identifier_type::alphanumeric) {
      return detail::compare(lhs.identifier, rhs.identifier);
    }

    return lhs.type == prerelease_identifier_type::alphanumeric ? 1 : -1;
  }